

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_finite_automaton.cpp
# Opt level: O0

int Omega_h::add_state(FiniteAutomaton *fa)

{
  FiniteAutomaton *t;
  int iVar1;
  int iVar2;
  Ref pvVar3;
  value_type_conflict1 local_1c;
  int local_18;
  int local_14;
  int j;
  int state;
  FiniteAutomaton *fa_local;
  
  _j = fa;
  local_14 = get_nstates(fa);
  t = _j;
  iVar1 = local_14 + 1;
  iVar2 = get_ncols<int>(&_j->table);
  resize<int>(&t->table,iVar1,iVar2);
  local_18 = 0;
  while( true ) {
    iVar1 = local_18;
    iVar2 = get_ncols<int>(&_j->table);
    if (iVar2 <= iVar1) break;
    pvVar3 = at<int>(&_j->table,local_14,local_18);
    *pvVar3 = -1;
    local_18 = local_18 + 1;
  }
  local_1c = -1;
  std::vector<int,_std::allocator<int>_>::push_back(&_j->accepted_tokens,&local_1c);
  return local_14;
}

Assistant:

int add_state(FiniteAutomaton& fa) {
  auto state = get_nstates(fa);
  resize(fa.table, state + 1, get_ncols(fa.table));
  for (int j = 0; j < get_ncols(fa.table); ++j) {
    at(fa.table, state, j) = -1;
  }
  fa.accepted_tokens.push_back(-1);
  return state;
}